

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O2

TPZFMatrix<long> * __thiscall
TPZFMatrix<long>::operator+=(TPZFMatrix<long> *this,TPZMatrix<long> *aBase)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  long *plVar4;
  long lVar5;
  long *plVar6;
  
  lVar2 = __dynamic_cast(aBase,&TPZMatrix<long>::typeinfo,&typeinfo,0);
  if (lVar2 == 0) {
    Error("TPZFMatrix<TVar> &TPZFMatrix<long>::operator+=(const TPZMatrix<TVar> &) [TVar = long]",
          " incompatible argument");
  }
  lVar3 = *(long *)(lVar2 + 8);
  if ((lVar3 != (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow) ||
     (lVar5 = *(long *)(lVar2 + 0x10),
     lVar5 != (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol)) {
    Error("Operator+= <matrices with different dimensions>",(char *)0x0);
    lVar3 = (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow;
    lVar5 = (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol;
  }
  plVar4 = this->fElem;
  plVar1 = plVar4 + lVar5 * lVar3;
  plVar6 = *(long **)(lVar2 + 0x20);
  for (; plVar4 < plVar1; plVar4 = plVar4 + 1) {
    lVar2 = *plVar6;
    plVar6 = plVar6 + 1;
    *plVar4 = *plVar4 + lVar2;
  }
  return this;
}

Assistant:

TPZFMatrix<TVar> & TPZFMatrix<TVar>::operator+=(const TPZMatrix<TVar> &aBase ) {
    auto A = dynamic_cast<const TPZFMatrix<TVar>*>(&aBase);
    if(!A){
        Error(__PRETTY_FUNCTION__," incompatible argument");
    }
    if ( (A->Rows() != this->Rows())  ||  (A->Cols() != this->Cols()) )
        Error( "Operator+= <matrices with different dimensions>" );
    
    int64_t size = ((int64_t)this->Rows()) * this->Cols();
    TVar * pm = fElem, *pmlast=pm+size;
    TVar * pa = A->fElem;
    while(pm < pmlast) (*pm++) += (*pa++);
    return( *this );
}